

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O1

string * __thiscall
cmTimestamp::CreateTimestampFromTimeT
          (string *__return_storage_ptr__,cmTimestamp *this,time_t timeT,string *formatString,
          bool utcFlag)

{
  ulong uVar1;
  pointer pcVar2;
  char flag;
  tm *ptVar3;
  ulong uVar4;
  ulong uVar5;
  tm timeStruct;
  time_t local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string local_88;
  tm local_68;
  
  local_98 = timeT;
  if (formatString->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)formatString,0,(char *)0x0,0x575ad4);
    if (utcFlag) {
      std::__cxx11::string::append((char *)formatString);
      goto LAB_0031bfde;
    }
  }
  else {
LAB_0031bfde:
    local_68.tm_isdst = 0;
    local_68._36_4_ = 0;
    local_68.tm_gmtoff = 0;
    local_68.tm_mon = 0;
    local_68.tm_year = 0;
    local_68.tm_wday = 0;
    local_68.tm_yday = 0;
    local_68.tm_sec = 0;
    local_68.tm_min = 0;
    local_68.tm_hour = 0;
    local_68.tm_mday = 0;
    local_68.tm_zone = (char *)0x0;
    if (utcFlag) {
      ptVar3 = gmtime(&local_98);
      goto LAB_0031c02b;
    }
  }
  local_68.tm_zone = (char *)0x0;
  local_68.tm_gmtoff = 0;
  local_68.tm_isdst = 0;
  local_68._36_4_ = 0;
  local_68.tm_wday = 0;
  local_68.tm_yday = 0;
  local_68.tm_mon = 0;
  local_68.tm_year = 0;
  local_68.tm_hour = 0;
  local_68.tm_mday = 0;
  local_68.tm_sec = 0;
  local_68.tm_min = 0;
  ptVar3 = localtime(&local_98);
LAB_0031c02b:
  if (ptVar3 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_68.tm_zone = ptVar3->tm_zone;
    local_68.tm_sec = ptVar3->tm_sec;
    local_68.tm_min = ptVar3->tm_min;
    local_68.tm_hour = ptVar3->tm_hour;
    local_68.tm_mday = ptVar3->tm_mday;
    local_68.tm_mon = ptVar3->tm_mon;
    local_68.tm_year = ptVar3->tm_year;
    local_68.tm_wday = ptVar3->tm_wday;
    local_68.tm_yday = ptVar3->tm_yday;
    local_68.tm_isdst = ptVar3->tm_isdst;
    local_68._36_4_ = *(undefined4 *)&ptVar3->field_0x24;
    local_68.tm_gmtoff = ptVar3->tm_gmtoff;
    local_90 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_90;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar4 = formatString->_M_string_length;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        pcVar2 = (formatString->_M_dataplus)._M_p;
        uVar1 = uVar5 + 1;
        if (uVar1 < uVar4) {
          flag = pcVar2[uVar1];
        }
        else {
          flag = '\0';
        }
        if (flag == '\0' || pcVar2[uVar5] != '%') {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
          AddTimestampComponent_abi_cxx11_(&local_88,this,flag,&local_68,local_98);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
          uVar5 = uVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        uVar5 = uVar5 + 1;
        uVar4 = formatString->_M_string_length;
      } while (uVar5 < uVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CreateTimestampFromTimeT(time_t timeT,
                                                  std::string formatString,
                                                  bool utcFlag) const
{
  if (formatString.empty()) {
    formatString = "%Y-%m-%dT%H:%M:%S";
    if (utcFlag) {
      formatString += "Z";
    }
  }

  struct tm timeStruct;
  memset(&timeStruct, 0, sizeof(timeStruct));

  struct tm* ptr = (struct tm*)CM_NULLPTR;
  if (utcFlag) {
    ptr = gmtime(&timeT);
  } else {
    ptr = localtime(&timeT);
  }

  if (ptr == CM_NULLPTR) {
    return std::string();
  }

  timeStruct = *ptr;

  std::string result;
  for (std::string::size_type i = 0; i < formatString.size(); ++i) {
    char c1 = formatString[i];
    char c2 = (i + 1 < formatString.size()) ? formatString[i + 1]
                                            : static_cast<char>(0);

    if (c1 == '%' && c2 != 0) {
      result += AddTimestampComponent(c2, timeStruct, timeT);
      ++i;
    } else {
      result += c1;
    }
  }

  return result;
}